

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_setFrequencyCorrection
              (SoapySDRDevice *device,int direction,size_t channel,double value)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  exception *ex;
  
  SoapySDRDevice_clearError();
  (**(code **)(*in_RDI + 0x158))(in_XMM0_Qa,in_RDI,in_ESI,in_RDX);
  return 0;
}

Assistant:

int SoapySDRDevice_setFrequencyCorrection(SoapySDRDevice *device, const int direction, const size_t channel, const double value)
{
    __SOAPY_SDR_C_TRY
    device->setFrequencyCorrection(direction, channel, value);
    __SOAPY_SDR_C_CATCH
}